

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_group_begin_titled(nk_context *ctx,char *id,char *title,nk_flags flags)

{
  nk_window *win_00;
  int len;
  nk_hash name;
  nk_uint *local_50;
  nk_uint *y_offset;
  nk_uint *x_offset;
  nk_window *win;
  nk_hash id_hash;
  int id_len;
  nk_flags flags_local;
  char *title_local;
  char *id_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4982,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  if (id == (char *)0x0) {
    __assert_fail("id",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4983,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4984,
                  "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                 );
  }
  if (ctx->current->layout != (nk_panel *)0x0) {
    if ((((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
        (ctx->current->layout == (nk_panel *)0x0)) || (id == (char *)0x0)) {
      ctx_local._4_4_ = 0;
    }
    else {
      win_00 = ctx->current;
      len = nk_strlen(id);
      name = nk_murmur_hash(id,len,2);
      y_offset = nk_find_value(win_00,name);
      if (y_offset == (nk_uint *)0x0) {
        y_offset = nk_add_value(ctx,win_00,name,0);
        local_50 = nk_add_value(ctx,win_00,name + 1,0);
        if (y_offset == (nk_uint *)0x0) {
          __assert_fail("x_offset",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                        ,0x4992,
                        "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                       );
        }
        if (local_50 == (nk_uint *)0x0) {
          __assert_fail("y_offset",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                        ,0x4993,
                        "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
                       );
        }
        if ((y_offset == (nk_uint *)0x0) || (local_50 == (nk_uint *)0x0)) {
          return 0;
        }
        *local_50 = 0;
        *y_offset = 0;
      }
      else {
        local_50 = nk_find_value(win_00,name + 1);
      }
      ctx_local._4_4_ = nk_group_scrolled_offset_begin(ctx,y_offset,local_50,title,flags);
    }
    return ctx_local._4_4_;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x4985,
                "int nk_group_begin_titled(struct nk_context *, const char *, const char *, nk_flags)"
               );
}

Assistant:

NK_API int
nk_group_begin_titled(struct nk_context *ctx, const char *id,
    const char *title, nk_flags flags)
{
    int id_len;
    nk_hash id_hash;
    struct nk_window *win;
    nk_uint *x_offset;
    nk_uint *y_offset;

    NK_ASSERT(ctx);
    NK_ASSERT(id);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout || !id)
        return 0;

    /* find persistent group scrollbar value */
    win = ctx->current;
    id_len = (int)nk_strlen(id);
    id_hash = nk_murmur_hash(id, (int)id_len, NK_PANEL_GROUP);
    x_offset = nk_find_value(win, id_hash);
    if (!x_offset) {
        x_offset = nk_add_value(ctx, win, id_hash, 0);
        y_offset = nk_add_value(ctx, win, id_hash+1, 0);

        NK_ASSERT(x_offset);
        NK_ASSERT(y_offset);
        if (!x_offset || !y_offset) return 0;
        *x_offset = *y_offset = 0;
    } else y_offset = nk_find_value(win, id_hash+1);
    return nk_group_scrolled_offset_begin(ctx, x_offset, y_offset, title, flags);
}